

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O0

TPZString * __thiscall TPZString::SubStr(TPZString *this,int start,int end)

{
  size_t sVar1;
  char *pcVar2;
  int64_t iVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  TPZVec<char> *in_RDI;
  int i;
  int endpos;
  int startpos;
  size_t len;
  TPZString *newstring;
  TPZString *in_stack_ffffffffffffff78;
  TPZString *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  int size;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  char cVar4;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  
  size = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  sVar1 = Length(in_stack_ffffffffffffff78);
  if ((sVar1 < (ulong)(long)in_EDX) || (in_ECX < in_EDX)) {
    TPZString(in_stack_ffffffffffffff80);
  }
  else {
    local_28 = in_EDX;
    if (in_EDX < 0) {
      local_28 = 0;
    }
    local_2c = in_ECX;
    if (sVar1 < (ulong)(long)in_ECX) {
      local_2c = (int)sVar1 + -1;
    }
    TPZString((TPZString *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),size);
    for (local_30 = local_28; local_30 <= local_2c; local_30 = local_30 + 1) {
      cVar4 = *(char *)(*(long *)(in_RSI + 8) + (long)local_30);
      pcVar2 = TPZVec<char>::operator[](in_RDI,(long)(local_30 - local_28));
      *pcVar2 = cVar4;
    }
    iVar3 = TPZVec<char>::NElements(in_RDI);
    pcVar2 = TPZVec<char>::operator[](in_RDI,iVar3 + -1);
    *pcVar2 = '\0';
  }
  return (TPZString *)in_RDI;
}

Assistant:

TPZString TPZString::SubStr(const int start, const int end) const
{
	size_t len = Length();
	if (start > len || start > end)
	{
		TPZString newstring;
		return newstring;
	}
	
	int startpos = start, endpos = end, i;
	
	if (startpos < 0) startpos = 0;
	
	if (endpos > len) endpos = len - 1; // null ending character index
	
	TPZString newstring(endpos - startpos + 2);
	for (i = startpos; i <= endpos; i++) newstring[i - startpos] = fStore[i];
	
	newstring[newstring.NElements() - 1] = '\0';
	return newstring;
}